

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString_&>,_char>,_QString>,_const_char_(&)[4]>,_QString>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  byte bVar1;
  QString *pQVar2;
  long lVar3;
  QChar *pQVar4;
  char16_t *pcVar5;
  QChar *__dest;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  
  QVar6.m_data = *(p->a).a.a.a.a;
  QVar6.m_size = 7;
  QAbstractConcatenable::convertFromUtf8(QVar6,out);
  pQVar2 = (p->a).a.a.a.b;
  lVar3 = (pQVar2->d).size;
  if (lVar3 != 0) {
    pcVar5 = (pQVar2->d).ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar5,lVar3 * 2);
  }
  pQVar4 = *out;
  bVar1 = (p->a).a.a.b;
  __dest = pQVar4 + lVar3 + 1;
  *out = __dest;
  pQVar4[lVar3].ucs = (ushort)bVar1;
  lVar3 = (p->a).a.b.d.size;
  if (lVar3 != 0) {
    pcVar5 = (p->a).a.b.d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar5,lVar3 * 2);
    __dest = *out;
  }
  *out = __dest + lVar3;
  QVar7.m_data = *(p->a).b;
  QVar7.m_size = 3;
  QAbstractConcatenable::convertFromUtf8(QVar7,out);
  lVar3 = (p->b).d.size;
  if (lVar3 != 0) {
    pcVar5 = (p->b).d.ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar5,lVar3 * 2);
  }
  *out = *out + lVar3;
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }